

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O2

int shared_destroy_entry(int idx)

{
  int iVar1;
  int iVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  
  iVar1 = 0x97;
  if ((-1 < idx) && (idx < shared_maxseg)) {
    iVar2 = 0;
    iVar1 = 0;
    if (shared_gt[(uint)idx].sem != -1) {
      iVar1 = semctl(shared_gt[(uint)idx].sem,0,0,0,in_R8,in_R9,0x97);
    }
    if (shared_gt[(uint)idx].handle != -1) {
      iVar2 = shmctl(shared_gt[(uint)idx].handle,0,(shmid_ds *)0x0);
    }
    if (iVar1 != 0) {
      iVar2 = iVar1;
    }
    iVar1 = shared_clear_entry(idx);
    if (iVar2 != 0) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

static  int shared_destroy_entry(int idx)       /* unconditionally destroy sema & shseg and clear entry */
 { int r, r2;
   union semun filler;

   if ((idx < 0) || (idx >= shared_maxseg)) return(SHARED_BADARG);
   r2 = r = SHARED_OK;
   filler.val = 0;                              /* this is to make cc happy (warning otherwise) */
   if (SHARED_INVALID != shared_gt[idx].sem)  r = semctl(shared_gt[idx].sem, 0, IPC_RMID, filler); /* destroy semaphore */
   if (SHARED_INVALID != shared_gt[idx].handle) r2 = shmctl(shared_gt[idx].handle, IPC_RMID, 0); /* destroy shared memory segment */
   if (SHARED_OK == r) r = r2;                  /* accumulate error code in r, free r2 */
   r2 = shared_clear_entry(idx);
   return((SHARED_OK == r) ? r2 : r);
 }